

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O2

void __thiscall
basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::push_back
          (vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *this,
          endpoint_cluster_etc_params *obj)

{
  uint uVar1;
  endpoint_cluster_etc_params *peVar2;
  ulong uVar3;
  
  peVar2 = this->m_p;
  uVar1 = this->m_size;
  uVar3 = (ulong)uVar1;
  if (peVar2 + uVar3 <= obj || (obj < peVar2 || peVar2 == (endpoint_cluster_etc_params *)0x0)) {
    if (this->m_capacity <= uVar1) {
      increase_capacity(this,uVar1 + 1,true,false);
      peVar2 = this->m_p;
      uVar3 = (ulong)this->m_size;
    }
    basisu_frontend::endpoint_cluster_etc_params::endpoint_cluster_etc_params(peVar2 + uVar3,obj);
    this->m_size = this->m_size + 1;
    return;
  }
  __assert_fail("!m_p || (&obj < m_p) || (&obj >= (m_p + m_size))",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                ,0x267,
                "void basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::push_back(const T &) [T = basisu::basisu_frontend::endpoint_cluster_etc_params]"
               );
}

Assistant:

BASISU_FORCE_INLINE void push_back(const T& obj)
      {
         assert(!m_p || (&obj < m_p) || (&obj >= (m_p + m_size)));

         if (m_size >= m_capacity)
            increase_capacity(m_size + 1, true);

         scalar_type<T>::construct(m_p + m_size, obj);
         m_size++;
      }